

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_reader.cpp
# Opt level: O2

void __thiscall duckdb::MetadataReader::ReadNextBlock(MetadataReader *this)

{
  idx_t *piVar1;
  MetadataPointer MVar2;
  vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_> *this_00;
  idx_t iVar3;
  IOException *this_01;
  InternalException *this_02;
  undefined8 extraout_RDX;
  ulong uVar4;
  MetaBlockPointer pointer;
  allocator local_39;
  MetaBlockPointer next_block_pointer;
  
  if (this->has_next_block == false) {
    this_01 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&next_block_pointer,"No more data remaining in MetadataReader",&local_39);
    IOException::IOException(this_01,(string *)&next_block_pointer);
    __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  MetadataManager::Pin((MetadataHandle *)&next_block_pointer,this->manager,&this->next_pointer);
  MetadataHandle::operator=(&this->block,(MetadataHandle *)&next_block_pointer);
  BufferHandle::~BufferHandle((BufferHandle *)&next_block_pointer.offset);
  this->index = (ulong)(byte)(this->next_pointer).field_0x7;
  piVar1 = (idx_t *)BasePtr(this);
  iVar3 = *piVar1;
  if (iVar3 == 0xffffffffffffffff) {
    this->has_next_block = false;
  }
  else {
    pointer.offset = (int)extraout_RDX;
    pointer.unused_padding = (int)((ulong)extraout_RDX >> 0x20);
    pointer.block_pointer = iVar3;
    MVar2 = FromDiskPointer(this,pointer);
    this->next_pointer = MVar2;
    next_block_pointer.offset = 0;
    next_block_pointer.unused_padding = 0;
    next_block_pointer.block_pointer = iVar3;
    if ((this->read_pointers).ptr != (vector<duckdb::MetaBlockPointer,_true> *)0x0) {
      this_00 = &optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>::operator->
                           (&this->read_pointers)->
                 super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>;
      ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::push_back
                (this_00,&next_block_pointer);
    }
  }
  uVar4 = this->next_offset;
  if (uVar4 < 8) {
    this->next_offset = 8;
    uVar4 = 8;
  }
  iVar3 = MetadataManager::GetMetadataBlockSize(this->manager);
  if (uVar4 <= iVar3) {
    this->offset = this->next_offset;
    this->next_offset = 8;
    iVar3 = MetadataManager::GetMetadataBlockSize(this->manager);
    this->capacity = iVar3;
    return;
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&next_block_pointer,"next_offset cannot be bigger than block size",&local_39)
  ;
  InternalException::InternalException(this_02,(string *)&next_block_pointer);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void MetadataReader::ReadNextBlock() {
	if (!has_next_block) {
		throw IOException("No more data remaining in MetadataReader");
	}
	block = manager.Pin(next_pointer);
	index = next_pointer.index;

	idx_t next_block = Load<idx_t>(BasePtr());
	if (next_block == idx_t(-1)) {
		has_next_block = false;
	} else {
		next_pointer = FromDiskPointer(MetaBlockPointer(next_block, 0));
		MetaBlockPointer next_block_pointer(next_block, 0);
		if (read_pointers) {
			read_pointers->push_back(next_block_pointer);
		}
	}
	if (next_offset < sizeof(block_id_t)) {
		next_offset = sizeof(block_id_t);
	}
	if (next_offset > GetMetadataManager().GetMetadataBlockSize()) {
		throw InternalException("next_offset cannot be bigger than block size");
	}
	offset = next_offset;
	next_offset = sizeof(block_id_t);
	capacity = GetMetadataManager().GetMetadataBlockSize();
}